

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

bool __thiscall
google::protobuf::internal::GeneratedExtensionFinder::Find
          (GeneratedExtensionFinder *this,int number,ExtensionInfo *output)

{
  EnumValidityFuncWithArg *pEVar1;
  FieldDescriptor *pFVar2;
  FieldType FVar3;
  bool bVar4;
  bool bVar5;
  undefined5 uVar6;
  _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
  *p_Var7;
  ExtensionInfo *pEVar8;
  const_iterator cVar9;
  key_type local_20;
  
  p_Var7 = (anonymous_namespace)::registry_;
  if ((anonymous_namespace)::registry_ ==
      (_Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
       *)0x0) {
    pEVar8 = (ExtensionInfo *)0x0;
  }
  else {
    local_20.first = this->containing_type_;
    local_20.second = number;
    cVar9 = std::tr1::
            _Hashtable<std::pair<const_google::protobuf::MessageLite_*,_int>,_std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::_Select1st<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_google::protobuf::hash<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ::find((anonymous_namespace)::registry_,&local_20);
    pEVar8 = (ExtensionInfo *)0x0;
    if (cVar9.
        super__Hashtable_iterator_base<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_false>
        ._M_cur_node != p_Var7->_M_buckets[p_Var7->_M_bucket_count]) {
      pEVar8 = &((cVar9.
                  super__Hashtable_iterator_base<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>,_false>
                 ._M_cur_node)->_M_v).second;
    }
  }
  if (pEVar8 != (ExtensionInfo *)0x0) {
    FVar3 = pEVar8->type;
    bVar4 = pEVar8->is_repeated;
    bVar5 = pEVar8->is_packed;
    uVar6 = *(undefined5 *)&pEVar8->field_0x3;
    pEVar1 = (pEVar8->field_3).enum_validity_check.func;
    pFVar2 = pEVar8->descriptor;
    (output->field_3).enum_validity_check.arg = (pEVar8->field_3).enum_validity_check.arg;
    output->descriptor = pFVar2;
    output->type = FVar3;
    output->is_repeated = bVar4;
    output->is_packed = bVar5;
    *(undefined5 *)&output->field_0x3 = uVar6;
    (output->field_3).enum_validity_check.func = pEVar1;
  }
  return pEVar8 != (ExtensionInfo *)0x0;
}

Assistant:

bool GeneratedExtensionFinder::Find(int number, ExtensionInfo* output) {
  const ExtensionInfo* extension =
      FindRegisteredExtension(containing_type_, number);
  if (extension == NULL) {
    return false;
  } else {
    *output = *extension;
    return true;
  }
}